

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O2

void __thiscall cmCustomCommandGenerator::FillEmulatorsWithArguments(cmCustomCommandGenerator *this)

{
  cmMakefile *this_00;
  pointer pcVar1;
  bool bVar2;
  TargetType TVar3;
  cmGeneratorTarget *this_01;
  cmValue cVar4;
  long lVar5;
  uint c;
  ulong uVar6;
  string_view arg;
  allocator<char> local_51;
  string local_50;
  
  this_00 = this->LG->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_CROSSCOMPILING",&local_51);
  bVar2 = cmMakefile::IsOn(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar2) {
    lVar5 = 0;
    for (uVar6 = 0;
        pcVar1 = (this->CommandLines).
                 super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        uVar6 < (((long)(this->CommandLines).
                        super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1) / 0x18 &
                0xffffffffU); uVar6 = uVar6 + 1) {
      this_01 = cmLocalGenerator::FindGeneratorTargetToUse
                          (this->LG,*(string **)
                                     ((long)&(pcVar1->
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     + lVar5));
      if (this_01 != (cmGeneratorTarget *)0x0) {
        TVar3 = cmGeneratorTarget::GetType(this_01);
        if (TVar3 == EXECUTABLE) {
          bVar2 = cmGeneratorTarget::IsImported(this_01);
          if (!bVar2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,"CROSSCOMPILING_EMULATOR",&local_51);
            cVar4 = cmGeneratorTarget::GetProperty(this_01,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            if (cVar4.Value != (string *)0x0) {
              arg._M_str = ((cVar4.Value)->_M_dataplus)._M_p;
              arg._M_len = (cVar4.Value)->_M_string_length;
              cmExpandList(arg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)((long)&(((this->EmulatorsWithArguments).
                                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data + lVar5),false);
            }
          }
        }
      }
      lVar5 = lVar5 + 0x18;
    }
  }
  return;
}

Assistant:

void cmCustomCommandGenerator::FillEmulatorsWithArguments()
{
  if (!this->LG->GetMakefile()->IsOn("CMAKE_CROSSCOMPILING")) {
    return;
  }

  for (unsigned int c = 0; c < this->GetNumberOfCommands(); ++c) {
    std::string const& argv0 = this->CommandLines[c][0];
    cmGeneratorTarget* target = this->LG->FindGeneratorTargetToUse(argv0);
    if (target && target->GetType() == cmStateEnums::EXECUTABLE &&
        !target->IsImported()) {

      cmValue emulator_property =
        target->GetProperty("CROSSCOMPILING_EMULATOR");
      if (!emulator_property) {
        continue;
      }

      cmExpandList(*emulator_property, this->EmulatorsWithArguments[c]);
    }
  }
}